

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::reserve
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,int m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int *piVar5;
  void *pvVar6;
  undefined8 *puVar7;
  int __fd;
  ulong __size;
  KeyVal *__src;
  int iVar8;
  KeyVal *__dest;
  
  __src = this->_a;
  iVar1 = *(int *)((long)&__src[-1].key.field_2 + 0xc);
  if (iVar1 < m) {
    iVar8 = iVar1 * 2;
    if (iVar1 * 2 <= m) {
      iVar8 = m;
    }
    iVar2 = *(int *)((long)&__src[-1].key.field_2 + 8);
    if (((long)iVar1 & 0x7ffffffffffffc0U) == 0) {
      pvVar6 = malloc((long)iVar8 << 5 | 0x10);
      if (pvVar6 == (void *)0x0) goto LAB_00133f70;
      __dest = (KeyVal *)((long)pvVar6 + 0x10);
      if (iVar2 <= m) {
        m = iVar2;
      }
      memcpy(__dest,__src,(long)(m << 5));
      __fd = (int)__src;
    }
    else {
      dup(this,m);
      iVar3 = *(int *)&this->_a[-1].value.super_Map<asl::String,_asl::String>.a._a;
      __size = (long)iVar8 << 5 | 0x10;
      piVar5 = (int *)realloc((void *)((long)&this->_a[-1].key.field_2 + 8),__size);
      __fd = (int)__size;
      if (piVar5 == (int *)0x0) {
LAB_00133f70:
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = dup2;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __dest = (KeyVal *)(piVar5 + 4);
      this->_a = __dest;
      piVar5[2] = iVar3;
      piVar5[1] = iVar8;
      *piVar5 = iVar2;
      iVar8 = iVar1;
    }
    if (iVar8 != iVar1) {
      dup(this,__fd);
      uVar4 = *(undefined4 *)&this->_a[-1].value.super_Map<asl::String,_asl::String>.a._a;
      ::free((void *)((long)&this->_a[-1].key.field_2 + 8));
      this->_a = __dest;
      *(undefined4 *)&__dest[-1].value.super_Map<asl::String,_asl::String>.a._a = uVar4;
      *(int *)((long)&__dest[-1].key.field_2 + 0xc) = iVar8;
      *(int *)((long)&__dest[-1].key.field_2 + 8) = iVar2;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}